

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
* __thiscall
deqp::gls::BuiltinPrecisionTests::
generateInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
          (Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
           *__return_storage_ptr__,BuiltinPrecisionTests *this,
          Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,Random *rnd)

{
  float fVar1;
  iterator iVar2;
  BuiltinPrecisionTests *pBVar3;
  Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pSVar4;
  size_t sVar5;
  int row;
  void *pvVar6;
  void *pvVar7;
  const_iterator cVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  undefined4 in_register_00000084;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  undefined4 uVar21;
  bool bVar22;
  In3 in3;
  In2 in2;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  fixedInputs;
  InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  tuple;
  In1 in1;
  In0 in0;
  set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  seenInputs;
  Void local_186;
  Void local_185;
  undefined4 local_184;
  vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
  *local_180;
  vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
  *local_178;
  vector<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_> *local_170;
  void *local_168;
  void *pvStack_160;
  long local_158;
  void *pvStack_150;
  void *local_148;
  long lStack_140;
  void *local_138;
  void *pvStack_130;
  long local_128;
  void *pvStack_120;
  void *local_118;
  long lStack_110;
  long local_100;
  undefined1 local_f8 [48];
  undefined4 local_c8;
  ulong local_c0;
  BuiltinPrecisionTests *local_b8;
  Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_b0;
  size_t local_a8;
  undefined8 local_a0;
  ulong local_98;
  value_type local_90;
  value_type local_78;
  _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  local_60;
  
  local_100 = CONCAT44(in_register_00000084,intPrecision);
  local_184 = SUB84(floatFormat,0);
  (__return_storage_ptr__->in3).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118 = (void *)0x0;
  lStack_110 = 0;
  local_128 = 0;
  pvStack_120 = (void *)0x0;
  local_138 = (void *)0x0;
  pvStack_130 = (void *)0x0;
  local_148 = (void *)0x0;
  lStack_140 = 0;
  local_158 = 0;
  pvStack_150 = (void *)0x0;
  local_168 = (void *)0x0;
  pvStack_160 = (void *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings);
  (**(code **)**(undefined8 **)(this + 8))(*(undefined8 **)(this + 8),samplings,&pvStack_150);
  (**(code **)**(undefined8 **)(this + 0x10))(*(undefined8 **)(this + 0x10),samplings,&local_138);
  (**(code **)**(undefined8 **)(this + 0x18))(*(undefined8 **)(this + 0x18),samplings,&pvStack_120);
  local_b8 = this;
  local_b0 = samplings;
  local_a8 = numSamples;
  if (pvStack_160 != local_168) {
    local_170 = &__return_storage_ptr__->in1;
    local_178 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in2;
    local_180 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in3;
    lVar19 = 0xc;
    uVar16 = 0;
    pvVar7 = pvStack_150;
    pvVar10 = local_148;
    pvVar6 = local_168;
    pvVar9 = pvStack_160;
    pvVar15 = local_148;
    do {
      bVar22 = pvVar15 != pvVar7;
      pvVar15 = pvVar7;
      if (bVar22) {
        lVar18 = 0xc;
        uVar17 = 0;
        pvVar12 = local_138;
        pvVar13 = pvStack_130;
        pvVar14 = pvStack_130;
        local_c0 = uVar16;
        do {
          bVar22 = pvVar14 != pvVar12;
          pvVar14 = pvVar12;
          if (bVar22) {
            uVar16 = 0;
            pvVar6 = pvStack_120;
            pvVar9 = local_118;
            local_a0 = uVar17;
            do {
              bVar22 = pvVar9 != pvVar6;
              pvVar9 = pvVar6;
              if (bVar22) {
                uVar20 = 0;
                local_98 = uVar16;
                do {
                  local_f8._0_4_ = 0.0;
                  local_f8._4_4_ = 0.0;
                  local_f8._8_4_ = 0.0;
                  local_f8._12_4_ = 0.0;
                  local_f8._16_4_ = 0.0;
                  local_f8._20_4_ = 0.0;
                  lVar11 = 0;
                  do {
                    *(undefined4 *)(local_f8 + lVar11 * 4) =
                         *(undefined4 *)((long)local_168 + lVar11 * 4 + lVar19 + -0xc);
                    *(undefined4 *)(local_f8 + lVar11 * 4 + 0xc) =
                         *(undefined4 *)((long)local_168 + lVar11 * 4 + lVar19);
                    lVar11 = lVar11 + 1;
                  } while (lVar11 != 3);
                  local_f8._24_4_ = 0.0;
                  local_f8._28_4_ = 0.0;
                  local_f8._32_4_ = 0.0;
                  local_f8._36_4_ = 0.0;
                  local_f8._40_4_ = 0.0;
                  local_f8._44_4_ = 0.0;
                  lVar11 = -0xc;
                  do {
                    *(undefined4 *)(local_f8 + lVar11 + 0x24) =
                         *(undefined4 *)((long)pvStack_150 + lVar11 + lVar18);
                    *(undefined4 *)((long)&local_c8 + lVar11) =
                         *(undefined4 *)((long)pvStack_150 + lVar11 + lVar18 + 0xc);
                    lVar11 = lVar11 + 4;
                  } while (lVar11 != 0);
                  std::
                  _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>>
                  ::
                  _M_insert_unique<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>const&>
                            ((_Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>>
                              *)&local_60,
                             (InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                              *)local_f8);
                  std::vector<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                  ::push_back(&__return_storage_ptr__->in0,(value_type *)local_f8);
                  std::vector<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                  ::push_back(local_170,(value_type *)(local_f8 + 0x18));
                  iVar2._M_current =
                       (__return_storage_ptr__->in2).
                       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar2._M_current ==
                      (__return_storage_ptr__->in2).
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                    ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                              (local_178,iVar2,(Void *)&local_c8);
                  }
                  else {
                    (__return_storage_ptr__->in2).
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                  }
                  iVar2._M_current =
                       (__return_storage_ptr__->in3).
                       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar2._M_current ==
                      (__return_storage_ptr__->in3).
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                    ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                              (local_180,iVar2,(Void *)((long)&local_c8 + 1));
                  }
                  else {
                    (__return_storage_ptr__->in3).
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                  }
                  uVar20 = uVar20 + 1;
                  pvVar6 = pvStack_120;
                  pvVar9 = local_118;
                  pvVar12 = local_138;
                  pvVar13 = pvStack_130;
                  uVar16 = local_98;
                  uVar17 = local_a0;
                } while (uVar20 < (ulong)((long)local_118 - (long)pvStack_120));
              }
              uVar16 = uVar16 + 1;
              pvVar7 = pvStack_150;
              pvVar10 = local_148;
              pvVar14 = pvVar13;
            } while (uVar16 < (ulong)((long)pvVar13 - (long)pvVar12));
          }
          uVar17 = uVar17 + 1;
          lVar18 = lVar18 + 0x18;
          pvVar6 = local_168;
          pvVar9 = pvStack_160;
          pvVar15 = pvVar10;
          uVar16 = local_c0;
        } while (uVar17 < (ulong)(((long)pvVar10 - (long)pvVar7 >> 3) * -0x5555555555555555));
      }
      uVar16 = uVar16 + 1;
      lVar19 = lVar19 + 0x18;
    } while (uVar16 < (ulong)(((long)pvVar9 - (long)pvVar6 >> 3) * -0x5555555555555555));
  }
  sVar5 = local_a8;
  pSVar4 = local_b0;
  pBVar3 = local_b8;
  if (local_100 != 0) {
    local_170 = &__return_storage_ptr__->in1;
    local_178 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in2;
    local_180 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in3;
    lVar19 = 0;
    uVar21 = local_184;
    do {
      (**(code **)(**(long **)pBVar3 + 8))(&local_78,*(long **)pBVar3,pSVar4,uVar21,sVar5);
      (**(code **)(**(long **)(pBVar3 + 8) + 8))
                (&local_90,*(long **)(pBVar3 + 8),pSVar4,uVar21,sVar5);
      (**(code **)(**(long **)(pBVar3 + 0x10) + 8))(*(long **)(pBVar3 + 0x10),pSVar4,uVar21,sVar5);
      (**(code **)(**(long **)(pBVar3 + 0x18) + 8))(*(long **)(pBVar3 + 0x18),pSVar4,uVar21,sVar5);
      uVar21 = local_184;
      local_f8._0_4_ = 0.0;
      local_f8._4_4_ = 0.0;
      local_f8._8_4_ = 0.0;
      local_f8._12_4_ = 0.0;
      local_f8._16_4_ = 0.0;
      local_f8._20_4_ = 0.0;
      lVar18 = 0;
      do {
        fVar1 = local_78.m_data.m_data[1].m_data[lVar18];
        *(float *)(local_f8 + lVar18 * 4) = local_78.m_data.m_data[0].m_data[lVar18];
        *(float *)(local_f8 + lVar18 * 4 + 0xc) = fVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      local_f8._24_4_ = 0.0;
      local_f8._28_4_ = 0.0;
      local_f8._32_4_ = 0.0;
      local_f8._36_4_ = 0.0;
      local_f8._40_4_ = 0.0;
      local_f8._44_4_ = 0.0;
      lVar18 = 3;
      do {
        fVar1 = local_90.m_data.m_data[0].m_data[lVar18];
        *(undefined4 *)(local_f8 + lVar18 * 4 + 0xc) =
             *(undefined4 *)((long)&local_a0 + lVar18 * 4 + 4);
        *(float *)(local_f8 + lVar18 * 4 + 0x18) = fVar1;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 6);
      cVar8 = std::
              _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
              ::find(&local_60,(key_type *)local_f8);
      if ((_Rb_tree_header *)cVar8._M_node == &local_60._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>>
        ::
        _M_insert_unique<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>const&>
                  ((_Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>>
                    *)&local_60,
                   (InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                    *)local_f8);
        std::vector<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>::push_back
                  (&__return_storage_ptr__->in0,&local_78);
        std::vector<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>::push_back
                  (local_170,&local_90);
        iVar2._M_current =
             (__return_storage_ptr__->in2).
             super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->in2).
            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
          ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                    (local_178,iVar2,&local_185);
        }
        else {
          (__return_storage_ptr__->in2).
          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar2._M_current =
             (__return_storage_ptr__->in3).
             super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->in3).
            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
          ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                    (local_180,iVar2,&local_186);
        }
        else {
          (__return_storage_ptr__->in3).
          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != local_100);
  }
  std::
  _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  ::~_Rb_tree(&local_60);
  if (pvStack_120 != (void *)0x0) {
    operator_delete(pvStack_120,lStack_110 - (long)pvStack_120);
  }
  if (local_138 != (void *)0x0) {
    operator_delete(local_138,local_128 - (long)local_138);
  }
  if (pvStack_150 != (void *)0x0) {
    operator_delete(pvStack_150,lStack_140 - (long)pvStack_150);
  }
  if (local_168 != (void *)0x0) {
    operator_delete(local_168,local_158 - (long)local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   Random&				rnd)
{
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}